

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrshift~.c
# Opt level: O1

t_int * rightshift_perform(t_int *w)

{
  ulong uVar1;
  int iVar2;
  undefined4 *puVar3;
  int iVar4;
  t_int tVar5;
  
  tVar5 = w[2];
  uVar1 = w[4];
  iVar2 = (int)uVar1;
  if ((int)w[3] != iVar2) {
    iVar4 = iVar2 - (int)w[3];
    puVar3 = (undefined4 *)(w[1] + (long)iVar2 * -4);
    do {
      puVar3 = puVar3 + -1;
      *(undefined4 *)(tVar5 + -4) = *puVar3;
      tVar5 = tVar5 + -4;
      iVar4 = iVar4 + 1;
    } while (iVar4 != 0);
  }
  if (iVar2 != 0) {
    memset((void *)((tVar5 - (uVar1 * 4 + 0x3fffffffc & 0x3fffffffc)) + -4),0,
           (uVar1 & 0xffffffff) << 2);
  }
  return w + 5;
}

Assistant:

static t_int *rightshift_perform(t_int *w)
{
    t_sample *in = (t_sample *)(w[1]);
    t_sample *out= (t_sample *)(w[2]);
    int n = (int)(w[3]);
    int shift = (int)(w[4]);
    n -= shift;
    in -= shift;
    while (n--)
        *--out = *--in;
    while (shift--)
        *--out = 0;
    return (w+5);
}